

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O0

void TTD::NSLogEvents::CreateScriptContext_Execute
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  JsRTCreateScriptContextAction_KnownObjects *pJVar1;
  _func_int **pp_Var2;
  RuntimeFunction *pRVar3;
  JsRTCreateScriptContextAction *pJVar4;
  void *pvVar5;
  GlobalObject *pGVar6;
  JavascriptLibrary *pJVar7;
  RecyclableObject *pRVar8;
  JavascriptBoolean *pJVar9;
  ScriptContext *local_28;
  ScriptContext *resCtx;
  JsRTCreateScriptContextAction *cAction;
  ThreadContextTTD *executeContext_local;
  EventLogEntry *evt_local;
  
  cAction = (JsRTCreateScriptContextAction *)executeContext;
  executeContext_local = (ThreadContextTTD *)evt;
  resCtx = (ScriptContext *)
           GetInlineEventDataAs<TTD::NSLogEvents::JsRTCreateScriptContextAction,(TTD::NSLogEvents::EventKind)17>
                     (evt);
  local_28 = (ScriptContext *)0x0;
  pJVar1 = cAction[0x14].KnownObjects;
  pvVar5 = ThreadContextTTD::GetRuntimeHandle((ThreadContextTTD *)cAction);
  (*(code *)pJVar1)(pvVar5,&local_28);
  pJVar4 = cAction;
  if (local_28 == (ScriptContext *)0x0) {
    TTDAbort_unrecoverable_error("Create failed");
  }
  pp_Var2 = (resCtx->super_ScriptContextInfo)._vptr_ScriptContextInfo;
  pGVar6 = Js::ScriptContextBase::GetGlobalObject(&local_28->super_ScriptContextBase);
  ThreadContextTTD::AddRootRef_Replay
            ((ThreadContextTTD *)pJVar4,(TTD_LOG_PTR_ID)pp_Var2,(RecyclableObject *)pGVar6);
  pJVar4 = cAction;
  local_28->ScriptContextLogTag =
       (TTD_LOG_PTR_ID)(resCtx->super_ScriptContextInfo)._vptr_ScriptContextInfo;
  pp_Var2 = (((resCtx->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject;
  pJVar7 = Js::ScriptContext::GetLibrary(local_28);
  pRVar8 = Js::JavascriptLibraryBase::GetUndefined(&pJVar7->super_JavascriptLibraryBase);
  ThreadContextTTD::AddRootRef_Replay((ThreadContextTTD *)pJVar4,(TTD_LOG_PTR_ID)pp_Var2,pRVar8);
  pJVar4 = cAction;
  pGVar6 = (((resCtx->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
           globalObject.ptr;
  pJVar7 = Js::ScriptContext::GetLibrary(local_28);
  pRVar8 = Js::JavascriptLibraryBase::GetNull(&pJVar7->super_JavascriptLibraryBase);
  ThreadContextTTD::AddRootRef_Replay((ThreadContextTTD *)pJVar4,(TTD_LOG_PTR_ID)pGVar6,pRVar8);
  pJVar4 = cAction;
  pRVar3 = (((resCtx->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
           mapConstructor.ptr;
  pJVar7 = Js::ScriptContext::GetLibrary(local_28);
  pJVar9 = Js::JavascriptLibraryBase::GetTrue(&pJVar7->super_JavascriptLibraryBase);
  ThreadContextTTD::AddRootRef_Replay
            ((ThreadContextTTD *)pJVar4,(TTD_LOG_PTR_ID)pRVar3,&pJVar9->super_RecyclableObject);
  pJVar4 = cAction;
  pRVar3 = (((resCtx->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
           setConstructor.ptr;
  pJVar7 = Js::ScriptContext::GetLibrary(local_28);
  pJVar9 = Js::JavascriptLibraryBase::GetFalse(&pJVar7->super_JavascriptLibraryBase);
  ThreadContextTTD::AddRootRef_Replay
            ((ThreadContextTTD *)pJVar4,(TTD_LOG_PTR_ID)pRVar3,&pJVar9->super_RecyclableObject);
  return;
}

Assistant:

void CreateScriptContext_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            const JsRTCreateScriptContextAction* cAction = GetInlineEventDataAs<JsRTCreateScriptContextAction, EventKind::CreateScriptContextActionTag>(evt);

            Js::ScriptContext* resCtx = nullptr;
            executeContext->TTDExternalObjectFunctions.pfCreateJsRTContextCallback(executeContext->GetRuntimeHandle(), &resCtx);
            TTDAssert(resCtx != nullptr, "Create failed");

            executeContext->AddRootRef_Replay(cAction->GlobalObject, resCtx->GetGlobalObject());
            resCtx->ScriptContextLogTag = cAction->GlobalObject;

            executeContext->AddRootRef_Replay(cAction->KnownObjects->UndefinedObject, resCtx->GetLibrary()->GetUndefined());
            executeContext->AddRootRef_Replay(cAction->KnownObjects->NullObject, resCtx->GetLibrary()->GetNull());
            executeContext->AddRootRef_Replay(cAction->KnownObjects->TrueObject, resCtx->GetLibrary()->GetTrue());
            executeContext->AddRootRef_Replay(cAction->KnownObjects->FalseObject, resCtx->GetLibrary()->GetFalse());
        }